

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O1

void __thiscall
Reset_addResetThatHasAParentComponent_Test::TestBody
          (Reset_addResetThatHasAParentComponent_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ComponentPtr c2;
  ComponentPtr c1;
  ResetPtr r;
  long *local_78;
  long *local_70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertionResult local_60;
  long local_50 [2];
  AssertHelper local_40 [8];
  shared_ptr *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  shared_ptr *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Reset::create();
  local_70 = (long *)0x0;
  local_78 = (long *)libcellml::Component::resetCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_60,"size_t(0)","c1->resetCount()",(unsigned_long *)&local_70,
             (unsigned_long *)&local_78);
  if (local_60.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (local_60.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_60.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0xd1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_70 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
      local_70 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_70 = (long *)0x0;
  local_78 = (long *)libcellml::Component::resetCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_60,"size_t(0)","c2->resetCount()",(unsigned_long *)&local_70,
             (unsigned_long *)&local_78);
  if (local_60.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (local_60.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_60.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0xd2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_70 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
      local_70 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar1 = libcellml::Component::addReset(local_28);
  local_70 = (long *)CONCAT71(local_70._1_7_,cVar1);
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar1 == '\0') {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(char *)&local_70,"c1->addReset(r)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0xd5,(char *)CONCAT71(local_60._1_7_,local_60.success_));
    testing::internal::AssertHelper::operator=(local_40,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(local_40);
    if ((long *)CONCAT71(local_60._1_7_,local_60.success_) != local_50) {
      operator_delete((long *)CONCAT71(local_60._1_7_,local_60.success_),local_50[0] + 1);
    }
    if (local_78 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_78 != (long *)0x0)) {
        (**(code **)(*local_78 + 8))();
      }
      local_78 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70 = (long *)0x1;
  local_78 = (long *)libcellml::Component::resetCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_60,"size_t(1)","c1->resetCount()",(unsigned_long *)&local_70,
             (unsigned_long *)&local_78);
  if (local_60.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (local_60.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_60.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0xd6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_70 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
      local_70 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_70 = (long *)0x0;
  local_78 = (long *)libcellml::Component::resetCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_60,"size_t(0)","c2->resetCount()",(unsigned_long *)&local_70,
             (unsigned_long *)&local_78);
  if (local_60.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (local_60.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_60.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0xd7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_70 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
      local_70 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar1 = libcellml::Component::addReset(local_38);
  local_70 = (long *)CONCAT71(local_70._1_7_,cVar1);
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar1 == '\0') {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(char *)&local_70,"c2->addReset(r)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0xda,(char *)CONCAT71(local_60._1_7_,local_60.success_));
    testing::internal::AssertHelper::operator=(local_40,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(local_40);
    if ((long *)CONCAT71(local_60._1_7_,local_60.success_) != local_50) {
      operator_delete((long *)CONCAT71(local_60._1_7_,local_60.success_),local_50[0] + 1);
    }
    if (local_78 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_78 != (long *)0x0)) {
        (**(code **)(*local_78 + 8))();
      }
      local_78 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70 = (long *)0x0;
  local_78 = (long *)libcellml::Component::resetCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_60,"size_t(0)","c1->resetCount()",(unsigned_long *)&local_70,
             (unsigned_long *)&local_78);
  if (local_60.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (local_60.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_60.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0xdb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_70 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
      local_70 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_70 = (long *)0x1;
  local_78 = (long *)libcellml::Component::resetCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_60,"size_t(1)","c2->resetCount()",(unsigned_long *)&local_70,
             (unsigned_long *)&local_78);
  if (local_60.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (local_60.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_60.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0xdc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_70 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
      local_70 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Reset, addResetThatHasAParentComponent)
{
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::ResetPtr r = libcellml::Reset::create();

    EXPECT_EQ(size_t(0), c1->resetCount());
    EXPECT_EQ(size_t(0), c2->resetCount());

    // Add r to c1.
    EXPECT_TRUE(c1->addReset(r));
    EXPECT_EQ(size_t(1), c1->resetCount());
    EXPECT_EQ(size_t(0), c2->resetCount());

    // Add r to c2, which effectively moves it from c1 to c2.
    EXPECT_TRUE(c2->addReset(r));
    EXPECT_EQ(size_t(0), c1->resetCount());
    EXPECT_EQ(size_t(1), c2->resetCount());
}